

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.hpp
# Opt level: O3

void __thiscall ot::commissioner::CommissionerApp::CommissionerApp(CommissionerApp *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_CommissionerHandler)._vptr_CommissionerHandler =
       (_func_int **)&PTR_OnJoinerRequest_abi_cxx11__002894a0;
  p_Var1 = &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header;
  (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mCommissioner).
  super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mCommissioner).
  super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mPanIdConflicts)._M_t._M_impl.super__Rb_tree_header;
  (this->mPanIdConflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mPanIdConflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mPanIdConflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mPanIdConflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mPanIdConflicts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mEnergyReports)._M_t._M_impl.super__Rb_tree_header;
  (this->mEnergyReports)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mEnergyReports)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mEnergyReports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mEnergyReports)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mEnergyReports)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ActiveOperationalDataset::ActiveOperationalDataset(&this->mActiveDataset);
  PendingOperationalDataset::PendingOperationalDataset(&this->mPendingDataset);
  (this->mCommDataset).mBorderAgentLocator = 0;
  (this->mCommDataset).mSessionId = 0;
  (this->mCommDataset).mSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mCommDataset).mSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mCommDataset).mSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mCommDataset).mAeSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mCommDataset).mAeSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mCommDataset).mAeSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mCommDataset).mNmkpSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mCommDataset).mNmkpSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mCommDataset).mNmkpSteeringData.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mCommDataset).mJoinerUdpPort = 0;
  (this->mCommDataset).mAeUdpPort = 0;
  (this->mCommDataset).mNmkpUdpPort = 0;
  (this->mCommDataset).mPresentFlags = 0;
  (this->mBbrDataset).mTriHostname._M_dataplus._M_p =
       (pointer)&(this->mBbrDataset).mTriHostname.field_2;
  (this->mBbrDataset).mTriHostname._M_string_length = 0;
  (this->mBbrDataset).mTriHostname.field_2._M_local_buf[0] = '\0';
  (this->mBbrDataset).mRegistrarHostname._M_dataplus._M_p =
       (pointer)&(this->mBbrDataset).mRegistrarHostname.field_2;
  (this->mBbrDataset).mRegistrarHostname._M_string_length = 0;
  (this->mBbrDataset).mRegistrarHostname.field_2._M_local_buf[0] = '\0';
  (this->mBbrDataset).mRegistrarIpv6Addr._M_dataplus._M_p =
       (pointer)&(this->mBbrDataset).mRegistrarIpv6Addr.field_2;
  (this->mBbrDataset).mRegistrarIpv6Addr._M_string_length = 0;
  (this->mBbrDataset).mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
  (this->mBbrDataset).mPresentFlags = 0;
  p_Var1 = &(this->mDiagAnsDataMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mDiagAnsDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mDiagAnsDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mDiagAnsDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mDiagAnsDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mDiagAnsDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

CommissionerApp() = default;